

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O1

bool __thiscall Diligent::VAOCache::VAOHashKey::operator==(VAOHashKey *this,VAOHashKey *Key)

{
  int iVar1;
  Uint32 UVar2;
  char (*in_RCX) [65];
  int *piVar3;
  bool bVar4;
  string msg;
  string local_50;
  
  if ((((this->Hash == Key->Hash) && (this->PsoUId == Key->PsoUId)) &&
      (this->IndexBufferUId == Key->IndexBufferUId)) &&
     (UVar2 = Key->UsedSlotsMask, this->UsedSlotsMask == UVar2)) {
    do {
      bVar4 = UVar2 == 0;
      if (bVar4) {
        return bVar4;
      }
      iVar1 = 0;
      if (UVar2 != 0) {
        for (; (UVar2 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
        }
      }
      if ((*(int *)((long)&this->Streams[0].BufferUId + (ulong)(uint)(iVar1 << 4)) < 0) ||
         (*(int *)((long)&Key->Streams[0].BufferUId + (ulong)(uint)(iVar1 << 4)) < 0)) {
        FormatString<char[26],char[65]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Streams[Slot].BufferUId >= 0 && Key.Streams[Slot].BufferUId >= 0"
                   ,in_RCX);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"operator==",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xea);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      piVar3 = (int *)((long)&this->Streams[0].BufferUId + (ulong)(uint)(iVar1 << 4));
      if (*piVar3 != *(int *)((long)&Key->Streams[0].BufferUId + (ulong)(uint)(iVar1 << 4))) {
        return bVar4;
      }
      UVar2 = UVar2 - 1 & UVar2;
      in_RCX = *(char (**) [65])((long)&Key->Streams[0].Offset + (ulong)(uint)(iVar1 << 4));
    } while (*(char (**) [65])(piVar3 + 2) == in_RCX);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool VAOCache::VAOHashKey::operator==(const VAOHashKey& Key) const noexcept
{
    if (Hash != Key.Hash)
        return false;

    // clang-format off
    if (PsoUId         != Key.PsoUId         ||
        IndexBufferUId != Key.IndexBufferUId ||
        UsedSlotsMask  != Key.UsedSlotsMask)
        return false;
    // clang-format on

    for (auto SlotMask = Key.UsedSlotsMask; SlotMask != 0;)
    {
        const auto SlotBit = ExtractLSB(SlotMask);
        const auto Slot    = PlatformMisc::GetLSB(SlotBit);
        VERIFY_EXPR(Streams[Slot].BufferUId >= 0 && Key.Streams[Slot].BufferUId >= 0);
        if (Streams[Slot] != Key.Streams[Slot])
            return false;
    }

    return true;
}